

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O3

uint16_t __thiscall World::first_empty_game_string_id(World *this,uint16_t initial_index)

{
  pointer pbVar1;
  ulong uVar2;
  ulong uVar3;
  long *plVar4;
  undefined6 in_register_00000032;
  
  uVar3 = CONCAT62(in_register_00000032,initial_index) & 0xffffffff;
  pbVar1 = (this->_game_strings).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = (long)(this->_game_strings).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5;
  if (uVar3 < uVar2) {
    plVar4 = (long *)((long)&pbVar1->_M_string_length +
                     (ulong)(uint)((int)CONCAT62(in_register_00000032,initial_index) << 5));
    do {
      if (*plVar4 == 0) {
        return (uint16_t)uVar3;
      }
      uVar3 = uVar3 + 1;
      plVar4 = plVar4 + 4;
    } while (uVar2 != uVar3);
  }
  return (uint16_t)uVar2;
}

Assistant:

uint16_t World::first_empty_game_string_id(uint16_t initial_index) const
{
    for(size_t i=initial_index ; i<_game_strings.size() ; ++i)
        if(_game_strings[i].empty())
            return (uint16_t) i;
    return _game_strings.size();
}